

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall Client::HandleTimeout(Client *this,void *param_1)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  __node_base *p_Var3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timeout, to stop connections",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  __mutex = &this->_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    p_Var3 = &(this->_sessions)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_nxt)->_M_nxt[6]._M_nxt)();
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void HandleTimeout(void*) {
        std::cout << "timeout, to stop connections" << std::endl;
        std::lock_guard<std::mutex> lock(_mutex);
        for (auto& session : _sessions) {
            session.first->Close();
        }
    }